

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_TOUCH(effect_handler_context_t *context)

{
  _Bool _Var1;
  wchar_t dam;
  anon_enum_32 aVar2;
  monster *pmVar3;
  monster *pmVar4;
  loc grid;
  trap *trap;
  anon_union_8_5_62f3dbed_for_which aVar5;
  wchar_t typ;
  wchar_t rad;
  source sVar6;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  rad = context->radius + (uint)(context->radius == L'\0');
  if ((context->origin).what == SRC_MONSTER) {
    pmVar3 = cave_monster(cave,(context->origin).which.grid.x);
    pmVar4 = monster_target_monster((effect_handler_context_t_conflict *)context);
    grid = cave_find_decoy(cave);
    if (grid.x == L'\0' || (ulong)grid >> 0x20 == 0) {
      if (pmVar4 == (monster *)0x0) goto LAB_00137710;
      sVar6 = source_monster((pmVar3->target).midx);
      aVar5 = sVar6.which;
      typ = context->subtype;
      grid.x = (pmVar4->grid).x;
      grid.y = (pmVar4->grid).y;
      aVar2 = sVar6.what;
    }
    else {
      trap = square_trap(cave,grid);
      sVar6 = source_trap(trap);
      aVar5 = sVar6.which;
      typ = context->subtype;
      aVar2 = sVar6.what;
    }
    sVar6._4_4_ = 0;
    sVar6.what = aVar2;
    sVar6.which.trap = aVar5.trap;
    _Var1 = project(sVar6,rad,grid,dam,typ,L'ô',L'\0','\0',context->obj);
  }
  else {
LAB_00137710:
    _Var1 = project_touch(dam,rad,context->subtype,false,context->obj);
    if (_Var1) {
      context->ident = true;
    }
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool effect_handler_TOUCH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int rad = context->radius ? context->radius : 1;

	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		struct loc decoy = cave_find_decoy(cave);

		/* Target decoy */
		if (decoy.y && decoy.x) {
			int flg = PROJECT_GRID | PROJECT_KILL | PROJECT_HIDE | PROJECT_ITEM | PROJECT_THRU;
			return (project(source_trap(square_trap(cave, decoy)),
					rad, decoy, dam, context->subtype,flg, 0, 0, context->obj));
		}

		/* Monster cast at monster */
		if (t_mon) {
			int flg = PROJECT_GRID | PROJECT_KILL | PROJECT_HIDE | PROJECT_ITEM | PROJECT_THRU;
			return (project(source_monster(mon->target.midx), rad,
							t_mon->grid, dam, context->subtype,
							flg, 0, 0, context->obj));
		}
	}

	if (project_touch(dam, rad, context->subtype, false, context->obj))
		context->ident = true;
	return true;
}